

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  ulong *puVar1;
  uint uVar2;
  int iVar3;
  short sVar4;
  long lVar5;
  int *piVar6;
  long *plVar7;
  BYTE *d;
  char *pcVar8;
  long *plVar9;
  uint uVar10;
  long *plVar11;
  BYTE *e_2;
  char *pcVar12;
  long lVar13;
  uint uVar14;
  int *piVar15;
  ulong *puVar16;
  ulong uVar17;
  int iVar18;
  long *plVar19;
  char *pcVar20;
  uint uVar21;
  ulong uVar22;
  ulong *puVar23;
  long lVar24;
  BYTE *e;
  ulong uVar25;
  long *plVar26;
  int iVar27;
  U16 *hashTable;
  bool bVar28;
  
  iVar27 = 0;
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x4020);
  }
  else {
    state = (void *)0x0;
  }
  if (acceleration < 2) {
    acceleration = 1;
  }
  if (0x10000 < acceleration) {
    acceleration = 0x10001;
  }
  if ((uint)inputSize < 0x7e000001) {
    iVar27 = inputSize + (uint)inputSize / 0xff + 0x10;
  }
  iVar3 = (int)dest;
  if (iVar27 <= maxOutputSize) {
    plVar19 = (long *)source;
    if (inputSize < 0x1000b) {
      if ((uint)inputSize < 0x7e000001) {
        if (inputSize != 0) {
          uVar2 = *(uint *)((long)state + 0x4010);
          *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
          *(uint *)((long)state + 0x4010) = uVar2 + inputSize;
          *(undefined4 *)((long)state + 0x4014) = 3;
          if (0xc < (uint)inputSize) {
            lVar24 = (long)source - (ulong)uVar2;
            *(short *)((long)state + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
                 (short)uVar2;
LAB_001440de:
            uVar22 = 1;
            plVar11 = (long *)((long)plVar19 + 1);
            iVar27 = *(int *)((long)plVar19 + 1);
            uVar21 = acceleration << 6;
            do {
              plVar9 = plVar11;
              plVar11 = (long *)(uVar22 + (long)plVar9);
              if (source + ((ulong)(uint)inputSize - 0xb) < plVar11) goto LAB_0014439a;
              uVar22 = (ulong)(uVar21 >> 6);
              uVar21 = uVar21 + 1;
              uVar25 = (ulong)((uint)(iVar27 * -0x61c8864f) >> 0x13);
              uVar17 = (ulong)*(ushort *)((long)state + uVar25 * 2);
              sVar4 = (short)lVar24;
              lVar13 = *plVar11;
              *(short *)((long)state + uVar25 * 2) = (short)plVar9 - sVar4;
              bVar28 = *(int *)(lVar24 + uVar17) != iVar27;
              iVar27 = (int)lVar13;
            } while (bVar28);
            pcVar8 = (char *)(lVar24 + uVar17);
            plVar11 = plVar9;
            if ((source < pcVar8) && (*(char *)((long)plVar9 + -1) == pcVar8[-1])) {
              pcVar20 = source + uVar17 + ~(ulong)uVar2;
              plVar26 = (long *)((long)plVar9 + -1);
              plVar7 = (long *)((long)plVar9 + -1);
              do {
                plVar9 = plVar7;
                plVar11 = plVar26;
                pcVar8 = pcVar20;
                if ((pcVar8 <= source) || (plVar11 <= plVar19)) break;
                pcVar20 = pcVar8 + -1;
                plVar26 = (long *)((long)plVar11 + -1);
                plVar7 = (long *)((long)plVar9 + -1);
              } while (*(char *)((long)plVar11 + -1) == pcVar8[-1]);
            }
            uVar22 = (long)plVar9 - (long)plVar19;
            if ((uint)uVar22 < 0xf) {
              plVar9 = (long *)(dest + 1);
              *dest = (char)uVar22 << 4;
            }
            else {
              *dest = -0x10;
              plVar9 = (long *)(dest + 2);
              for (uVar21 = (uint)uVar22 - 0xf; 0xfe < uVar21; uVar21 = uVar21 - 0xff) {
                *(char *)((long)plVar9 + -1) = -1;
                plVar9 = (long *)((long)plVar9 + 1);
              }
              *(char *)((long)plVar9 + -1) = (char)uVar21;
            }
            plVar26 = (long *)((uVar22 & 0xffffffff) + (long)plVar9);
            do {
              *plVar9 = *plVar19;
              plVar9 = plVar9 + 1;
              plVar19 = plVar19 + 1;
              pcVar20 = dest;
            } while (plVar9 < plVar26);
            do {
              *(short *)plVar26 = (short)plVar11 - (short)pcVar8;
              dest = (char *)((long)plVar26 + 2);
              puVar1 = (ulong *)((long)plVar11 + 4);
              puVar16 = (ulong *)(pcVar8 + 4);
              puVar23 = puVar1;
              if (puVar1 < source + ((ulong)(uint)inputSize - 0xc)) {
                if (*puVar16 == *puVar1) {
                  puVar16 = (ulong *)(pcVar8 + 0xc);
                  puVar23 = (ulong *)((long)plVar11 + 0xc);
                  goto LAB_00144239;
                }
                uVar17 = *puVar1 ^ *puVar16;
                uVar22 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                  }
                }
                uVar22 = uVar22 >> 3 & 0x1fffffff;
                plVar19 = (long *)((long)plVar11 + uVar22 + 4);
LAB_001442b6:
                *pcVar20 = *pcVar20 + (char)uVar22;
              }
              else {
LAB_00144239:
                if (puVar23 < source + ((ulong)(uint)inputSize - 0xc)) {
                  if (*puVar16 == *puVar23) goto code_r0x0014424e;
                  uVar17 = *puVar23 ^ *puVar16;
                  uVar22 = 0;
                  if (uVar17 != 0) {
                    for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  puVar23 = (ulong *)((long)puVar23 + (uVar22 >> 3 & 0x1fffffff));
                }
                else {
                  if ((puVar23 < source + ((ulong)(uint)inputSize - 8)) &&
                     ((int)*puVar16 == (int)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 4);
                    puVar16 = (ulong *)((long)puVar16 + 4);
                  }
                  if ((puVar23 < source + ((ulong)(uint)inputSize - 6)) &&
                     ((short)*puVar16 == (short)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 2);
                    puVar16 = (ulong *)((long)puVar16 + 2);
                  }
                  if (puVar23 < source + ((ulong)(uint)inputSize - 5)) {
                    puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar16 == (char)*puVar23));
                  }
                }
                uVar22 = (long)puVar23 - (long)puVar1;
                plVar19 = (long *)((long)plVar11 + (uVar22 & 0xffffffff) + 4);
                if ((uint)uVar22 < 0xf) goto LAB_001442b6;
                *pcVar20 = *pcVar20 + '\x0f';
                dest[0] = -1;
                dest[1] = -1;
                dest[2] = -1;
                dest[3] = -1;
                lVar13 = 0;
                for (uVar21 = (uint)uVar22 - 0xf; 0x3fb < uVar21; uVar21 = uVar21 - 0x3fc) {
                  pcVar8 = (char *)((long)plVar26 + lVar13 + 6);
                  pcVar8[0] = -1;
                  pcVar8[1] = -1;
                  pcVar8[2] = -1;
                  pcVar8[3] = -1;
                  lVar13 = lVar13 + 4;
                }
                lVar5 = lVar13 + (ulong)(uVar21 & 0xffff) / 0xff;
                dest = (char *)((long)plVar26 + lVar5 + 3);
                *(char *)((long)plVar26 + lVar5 + 2) =
                     (char)lVar13 +
                     (char)((ushort)uVar21 / 0xff) + ((char)puVar23 - (char)plVar11) + -0x13;
              }
              if (source + ((ulong)(uint)inputSize - 0xb) <= plVar19) break;
              *(short *)((long)state +
                        (ulong)((uint)(*(int *)((long)plVar19 + -2) * -0x61c8864f) >> 0x13) * 2) =
                   ((short)plVar19 + -2) - sVar4;
              lVar13 = *plVar19;
              uVar17 = (ulong)((uint)((int)lVar13 * -0x61c8864f) >> 0x13);
              uVar22 = (ulong)*(ushort *)((long)state + uVar17 * 2);
              pcVar8 = (char *)(lVar24 + uVar22);
              *(short *)((long)state + uVar17 * 2) = (short)plVar19 - sVar4;
              if (*(int *)(lVar24 + uVar22) != (int)lVar13) goto LAB_001440de;
              plVar26 = (long *)(dest + 1);
              *dest = '\0';
              plVar11 = plVar19;
              pcVar20 = dest;
            } while( true );
          }
LAB_0014439a:
          pcVar8 = source + ((ulong)(uint)inputSize - (long)plVar19);
          if (pcVar8 < (char *)0xf) {
            *dest = (char)pcVar8 << 4;
          }
          else {
            *dest = -0x10;
            for (pcVar20 = pcVar8 + -0xf; dest = dest + 1, (char *)0xfe < pcVar20;
                pcVar20 = pcVar20 + -0xff) {
              *dest = -1;
            }
            *dest = (char)pcVar20;
          }
          goto LAB_001443dc;
        }
        goto LAB_00143d13;
      }
    }
    else if ((uint)inputSize < 0x7e000001) {
      uVar2 = *(uint *)((long)state + 0x4010);
      lVar24 = (long)source - (ulong)uVar2;
      *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
      *(uint *)((long)state + 0x4010) = inputSize + uVar2;
      *(undefined4 *)((long)state + 0x4014) = 2;
      *(uint *)((long)state + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar2;
      pcVar8 = dest;
LAB_00143981:
      lVar13 = *(long *)((long)plVar19 + 1);
      uVar22 = 1;
      plVar11 = (long *)((long)plVar19 + 1);
      uVar21 = acceleration << 6;
      while( true ) {
        plVar9 = (long *)(uVar22 + (long)plVar11);
        dest = pcVar8;
        if (source + ((ulong)(uint)inputSize - 0xb) < plVar9) goto LAB_00143c44;
        uVar17 = (ulong)(lVar13 * -0x30e4432345000000) >> 0x34;
        uVar10 = *(uint *)((long)state + uVar17 * 4);
        uVar22 = (ulong)uVar10;
        iVar27 = (int)lVar24;
        uVar14 = (int)plVar11 - iVar27;
        lVar13 = *plVar9;
        *(uint *)((long)state + uVar17 * 4) = uVar14;
        if ((uVar14 <= uVar10 + 0xffff) && (*(int *)(lVar24 + uVar22) == (int)*plVar11)) break;
        uVar22 = (ulong)(uVar21 >> 6);
        uVar21 = uVar21 + 1;
        plVar11 = plVar9;
      }
      piVar15 = (int *)(lVar24 + uVar22);
      plVar9 = plVar11;
      if ((source < piVar15) && (*(char *)((long)plVar11 + -1) == *(char *)((long)piVar15 - 1))) {
        piVar6 = (int *)(source + uVar22 + ~(ulong)uVar2);
        plVar26 = (long *)((long)plVar11 + -1);
        plVar7 = (long *)((long)plVar11 + -1);
        do {
          plVar9 = plVar7;
          plVar11 = plVar26;
          piVar15 = piVar6;
          if ((piVar15 <= source) || (plVar9 <= plVar19)) break;
          piVar6 = (int *)((long)piVar15 + -1);
          plVar26 = (long *)((long)plVar11 + -1);
          plVar7 = (long *)((long)plVar9 + -1);
        } while (*(char *)((long)plVar9 + -1) == *(char *)((long)piVar15 + -1));
      }
      uVar22 = (long)plVar11 - (long)plVar19;
      if ((uint)uVar22 < 0xf) {
        plVar11 = (long *)(pcVar8 + 1);
        *pcVar8 = (char)uVar22 << 4;
      }
      else {
        *pcVar8 = -0x10;
        plVar11 = (long *)(pcVar8 + 2);
        for (uVar21 = (uint)uVar22 - 0xf; 0xfe < uVar21; uVar21 = uVar21 - 0xff) {
          *(char *)((long)plVar11 + -1) = -1;
          plVar11 = (long *)((long)plVar11 + 1);
        }
        *(char *)((long)plVar11 + -1) = (char)uVar21;
      }
      plVar26 = (long *)((uVar22 & 0xffffffff) + (long)plVar11);
      do {
        *plVar11 = *plVar19;
        plVar11 = plVar11 + 1;
        plVar19 = plVar19 + 1;
      } while (plVar11 < plVar26);
      do {
        *(short *)plVar26 = (short)plVar9 - (short)piVar15;
        dest = (char *)((long)plVar26 + 2);
        puVar1 = (ulong *)((long)plVar9 + 4);
        puVar16 = (ulong *)(piVar15 + 1);
        puVar23 = puVar1;
        if (puVar1 < source + ((ulong)(uint)inputSize - 0xc)) {
          if (*puVar16 == *puVar1) {
            puVar16 = (ulong *)(piVar15 + 3);
            puVar23 = (ulong *)((long)plVar9 + 0xc);
            goto LAB_00143ae1;
          }
          uVar17 = *puVar1 ^ *puVar16;
          uVar22 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          uVar22 = uVar22 >> 3 & 0x1fffffff;
          plVar19 = (long *)((long)plVar9 + uVar22 + 4);
LAB_00143b5e:
          *pcVar8 = *pcVar8 + (char)uVar22;
        }
        else {
LAB_00143ae1:
          if (puVar23 < source + ((ulong)(uint)inputSize - 0xc)) {
            if (*puVar16 == *puVar23) goto code_r0x00143af6;
            uVar17 = *puVar23 ^ *puVar16;
            uVar22 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            puVar23 = (ulong *)((long)puVar23 + (uVar22 >> 3 & 0x1fffffff));
          }
          else {
            if ((puVar23 < source + ((ulong)(uint)inputSize - 8)) &&
               ((int)*puVar16 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar16 = (ulong *)((long)puVar16 + 4);
            }
            if ((puVar23 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar16 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar16 = (ulong *)((long)puVar16 + 2);
            }
            if (puVar23 < source + ((ulong)(uint)inputSize - 5)) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar16 == (char)*puVar23));
            }
          }
          uVar22 = (long)puVar23 - (long)puVar1;
          plVar19 = (long *)((long)plVar9 + (uVar22 & 0xffffffff) + 4);
          if ((uint)uVar22 < 0xf) goto LAB_00143b5e;
          *pcVar8 = *pcVar8 + '\x0f';
          dest[0] = -1;
          dest[1] = -1;
          dest[2] = -1;
          dest[3] = -1;
          lVar13 = 0;
          for (uVar21 = (uint)uVar22 - 0xf; 0x3fb < uVar21; uVar21 = uVar21 - 0x3fc) {
            pcVar8 = (char *)((long)plVar26 + lVar13 + 6);
            pcVar8[0] = -1;
            pcVar8[1] = -1;
            pcVar8[2] = -1;
            pcVar8[3] = -1;
            lVar13 = lVar13 + 4;
          }
          lVar5 = lVar13 + (ulong)(uVar21 & 0xffff) / 0xff;
          dest = (char *)((long)plVar26 + lVar5 + 3);
          *(char *)((long)plVar26 + lVar5 + 2) =
               (char)lVar13 + (char)((ushort)uVar21 / 0xff) + ((char)puVar23 - (char)plVar9) + -0x13
          ;
        }
        if (source + ((ulong)(uint)inputSize - 0xb) <= plVar19) goto LAB_00143c44;
        *(int *)((long)state +
                ((ulong)(*(long *)((long)plVar19 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)plVar19 + -2) - iVar27;
        uVar22 = (ulong)(*plVar19 * -0x30e4432345000000) >> 0x34;
        uVar10 = (int)plVar19 - iVar27;
        uVar21 = *(uint *)((long)state + uVar22 * 4);
        piVar15 = (int *)((ulong)uVar21 + lVar24);
        *(uint *)((long)state + uVar22 * 4) = uVar10;
        pcVar8 = dest;
        if ((uVar21 + 0xffff < uVar10) || (*piVar15 != (int)*plVar19)) goto LAB_00143981;
        plVar26 = (long *)(dest + 1);
        *dest = '\0';
        plVar9 = plVar19;
      } while( true );
    }
    return 0;
  }
  plVar19 = (long *)source;
  if (0x1000a < inputSize) {
    if (0x7e000000 < (uint)inputSize) {
      return 0;
    }
    uVar2 = *(uint *)((long)state + 0x4010);
    lVar24 = (long)source - (ulong)uVar2;
    *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
    pcVar8 = dest + maxOutputSize;
    *(uint *)((long)state + 0x4010) = inputSize + uVar2;
    *(undefined4 *)((long)state + 0x4014) = 2;
    *(uint *)((long)state + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar2;
    pcVar20 = dest;
LAB_001435de:
    uVar22 = 1;
    lVar13 = *(long *)((long)plVar19 + 1);
    plVar11 = (long *)((long)plVar19 + 1);
    uVar21 = acceleration << 6;
    while( true ) {
      plVar9 = (long *)(uVar22 + (long)plVar11);
      dest = pcVar20;
      if (source + ((ulong)(uint)inputSize - 0xb) < plVar9) goto LAB_00143c86;
      uVar17 = (ulong)(lVar13 * -0x30e4432345000000) >> 0x34;
      uVar10 = *(uint *)((long)state + uVar17 * 4);
      uVar22 = (ulong)uVar10;
      iVar27 = (int)lVar24;
      uVar14 = (int)plVar11 - iVar27;
      lVar13 = *plVar9;
      *(uint *)((long)state + uVar17 * 4) = uVar14;
      if ((uVar14 <= uVar10 + 0xffff) && (*(int *)(lVar24 + uVar22) == (int)*plVar11)) break;
      uVar22 = (ulong)(uVar21 >> 6);
      uVar21 = uVar21 + 1;
      plVar11 = plVar9;
    }
    piVar15 = (int *)(lVar24 + uVar22);
    plVar9 = plVar11;
    if ((source < piVar15) && (*(char *)((long)plVar11 + -1) == *(char *)((long)piVar15 - 1))) {
      piVar6 = (int *)(source + uVar22 + ~(ulong)uVar2);
      plVar26 = (long *)((long)plVar11 + -1);
      plVar7 = (long *)((long)plVar11 + -1);
      do {
        plVar9 = plVar7;
        plVar11 = plVar26;
        piVar15 = piVar6;
        if ((piVar15 <= source) || (plVar11 <= plVar19)) break;
        piVar6 = (int *)((long)piVar15 + -1);
        plVar26 = (long *)((long)plVar11 + -1);
        plVar7 = (long *)((long)plVar9 + -1);
      } while (*(char *)((long)plVar11 + -1) == *(char *)((long)piVar15 + -1));
    }
    uVar22 = (long)plVar9 - (long)plVar19;
    if (pcVar8 < pcVar20 + (uVar22 & 0xffffffff) / 0xff + (uVar22 & 0xffffffff) + 9) {
      return 0;
    }
    if ((uint)uVar22 < 0xf) {
      plVar9 = (long *)(pcVar20 + 1);
      *pcVar20 = (char)uVar22 << 4;
    }
    else {
      *pcVar20 = -0x10;
      plVar9 = (long *)(pcVar20 + 2);
      for (uVar21 = (uint)uVar22 - 0xf; 0xfe < uVar21; uVar21 = uVar21 - 0xff) {
        *(char *)((long)plVar9 + -1) = -1;
        plVar9 = (long *)((long)plVar9 + 1);
      }
      *(char *)((long)plVar9 + -1) = (char)uVar21;
    }
    plVar26 = (long *)((uVar22 & 0xffffffff) + (long)plVar9);
    do {
      *plVar9 = *plVar19;
      plVar9 = plVar9 + 1;
      plVar19 = plVar19 + 1;
    } while (plVar9 < plVar26);
    do {
      *(short *)plVar26 = (short)plVar11 - (short)piVar15;
      puVar1 = (ulong *)((long)plVar11 + 4);
      puVar16 = (ulong *)(piVar15 + 1);
      puVar23 = puVar1;
      if (source + ((ulong)(uint)inputSize - 0xc) <= puVar1) {
LAB_00143756:
        iVar18 = ((int)puVar23 - (int)plVar11) + -4;
LAB_0014375e:
        if (puVar23 < source + ((ulong)(uint)inputSize - 0xc)) {
          if (*puVar16 == *puVar23) goto code_r0x00143772;
          uVar17 = *puVar23 ^ *puVar16;
          uVar22 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          uVar21 = ((uint)(uVar22 >> 3) & 0x1fffffff) + iVar18;
        }
        else {
          if ((puVar23 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar16 == (int)*puVar23))
          {
            puVar23 = (ulong *)((long)puVar23 + 4);
            puVar16 = (ulong *)((long)puVar16 + 4);
          }
          if ((puVar23 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar16 == (short)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 2);
            puVar16 = (ulong *)((long)puVar16 + 2);
          }
          if (puVar23 < source + ((ulong)(uint)inputSize - 5)) {
            puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar16 == (char)*puVar23));
          }
          uVar21 = (int)puVar23 - (int)puVar1;
        }
        goto LAB_0014379a;
      }
      if (*puVar16 == *puVar1) {
        puVar16 = (ulong *)(piVar15 + 3);
        puVar23 = (ulong *)((long)plVar11 + 0xc);
        goto LAB_00143756;
      }
      uVar22 = *puVar1 ^ *puVar16;
      lVar13 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar21 = (uint)lVar13 >> 3;
LAB_0014379a:
      if (pcVar8 < (char *)((long)plVar26 + (ulong)(uVar21 + 0xf0) / 0xff + 8)) {
        return 0;
      }
      dest = (char *)((long)plVar26 + 2);
      if (uVar21 < 0xf) {
        *pcVar20 = *pcVar20 + (char)uVar21;
      }
      else {
        *pcVar20 = *pcVar20 + '\x0f';
        dest[0] = -1;
        dest[1] = -1;
        dest[2] = -1;
        dest[3] = -1;
        lVar13 = 0;
        for (uVar10 = uVar21 - 0xf; 0x3fb < uVar10; uVar10 = uVar10 - 0x3fc) {
          pcVar20 = (char *)((long)plVar26 + lVar13 + 6);
          pcVar20[0] = -1;
          pcVar20[1] = -1;
          pcVar20[2] = -1;
          pcVar20[3] = -1;
          lVar13 = lVar13 + 4;
        }
        lVar5 = lVar13 + ((ulong)uVar10 & 0xffff) / 0xff;
        dest = (char *)((long)plVar26 + lVar5 + 3);
        *(char *)((long)plVar26 + lVar5 + 2) =
             (char)lVar13 + (char)((ushort)uVar10 / 0xff) + (char)uVar21 + -0xf;
      }
      lVar13 = (long)plVar11 + (ulong)uVar21;
      plVar11 = (long *)(lVar13 + 4);
      plVar19 = plVar11;
      if (source + ((ulong)(uint)inputSize - 0xb) <= plVar11) goto LAB_00143c86;
      *(int *)((long)state + ((ulong)(*(long *)(lVar13 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)lVar13 + 2) - iVar27;
      uVar22 = (ulong)(*plVar11 * -0x30e4432345000000) >> 0x34;
      uVar10 = (int)plVar11 - iVar27;
      uVar21 = *(uint *)((long)state + uVar22 * 4);
      piVar15 = (int *)((ulong)uVar21 + lVar24);
      *(uint *)((long)state + uVar22 * 4) = uVar10;
      pcVar20 = dest;
      if ((uVar21 + 0xffff < uVar10) || (*piVar15 != *(int *)plVar11)) goto LAB_001435de;
      plVar26 = (long *)(dest + 1);
      *dest = '\0';
    } while( true );
  }
  if (0x7e000000 < (uint)inputSize) {
    return 0;
  }
  if (inputSize == 0) {
    if (maxOutputSize < 1) {
      return 0;
    }
LAB_00143d13:
    *dest = '\0';
    return 1;
  }
  uVar2 = *(uint *)((long)state + 0x4010);
  pcVar8 = dest + maxOutputSize;
  *(int *)((long)state + 0x4018) = *(int *)((long)state + 0x4018) + inputSize;
  *(uint *)((long)state + 0x4010) = uVar2 + inputSize;
  *(undefined4 *)((long)state + 0x4014) = 3;
  if (0xc < (uint)inputSize) {
    lVar24 = (long)source - (ulong)uVar2;
    *(short *)((long)state + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
         (short)uVar2;
LAB_00143d8a:
    uVar22 = 1;
    plVar11 = (long *)((long)plVar19 + 1);
    uVar21 = acceleration << 6;
    iVar27 = *(int *)((long)plVar19 + 1);
    do {
      plVar9 = plVar11;
      plVar11 = (long *)(uVar22 + (long)plVar9);
      if (source + ((ulong)(uint)inputSize - 0xb) < plVar11) goto LAB_001443f7;
      uVar22 = (ulong)(uVar21 >> 6);
      uVar21 = uVar21 + 1;
      uVar25 = (ulong)((uint)(iVar27 * -0x61c8864f) >> 0x13);
      uVar17 = (ulong)*(ushort *)((long)state + uVar25 * 2);
      sVar4 = (short)lVar24;
      lVar13 = *plVar11;
      *(short *)((long)state + uVar25 * 2) = (short)plVar9 - sVar4;
      bVar28 = *(int *)(lVar24 + uVar17) != iVar27;
      iVar27 = (int)lVar13;
    } while (bVar28);
    pcVar20 = (char *)(lVar24 + uVar17);
    plVar11 = plVar9;
    if ((source < pcVar20) && (*(char *)((long)plVar9 + -1) == pcVar20[-1])) {
      pcVar12 = source + uVar17 + ~(ulong)uVar2;
      plVar26 = (long *)((long)plVar9 + -1);
      plVar7 = (long *)((long)plVar9 + -1);
      do {
        plVar11 = plVar7;
        plVar9 = plVar26;
        pcVar20 = pcVar12;
        if ((pcVar20 <= source) || (plVar9 <= plVar19)) break;
        pcVar12 = pcVar20 + -1;
        plVar26 = (long *)((long)plVar9 + -1);
        plVar7 = (long *)((long)plVar11 + -1);
      } while (*(char *)((long)plVar9 + -1) == pcVar20[-1]);
    }
    uVar22 = (long)plVar11 - (long)plVar19;
    if (pcVar8 < dest + (uVar22 & 0xffffffff) / 0xff + (uVar22 & 0xffffffff) + 9) {
      return 0;
    }
    if ((uint)uVar22 < 0xf) {
      plVar11 = (long *)(dest + 1);
      *dest = (char)uVar22 << 4;
    }
    else {
      *dest = -0x10;
      plVar11 = (long *)(dest + 2);
      for (uVar21 = (uint)uVar22 - 0xf; 0xfe < uVar21; uVar21 = uVar21 - 0xff) {
        *(char *)((long)plVar11 + -1) = -1;
        plVar11 = (long *)((long)plVar11 + 1);
      }
      *(char *)((long)plVar11 + -1) = (char)uVar21;
    }
    plVar26 = (long *)((uVar22 & 0xffffffff) + (long)plVar11);
    do {
      *plVar11 = *plVar19;
      plVar11 = plVar11 + 1;
      plVar19 = plVar19 + 1;
      pcVar12 = dest;
    } while (plVar11 < plVar26);
    do {
      *(short *)plVar26 = (short)plVar9 - (short)pcVar20;
      puVar1 = (ulong *)((long)plVar9 + 4);
      puVar16 = (ulong *)(pcVar20 + 4);
      puVar23 = puVar1;
      if (source + ((ulong)(uint)inputSize - 0xc) <= puVar1) {
LAB_00143ef7:
        iVar27 = ((int)puVar23 - (int)plVar9) + -4;
LAB_00143eff:
        if (puVar23 < source + ((ulong)(uint)inputSize - 0xc)) {
          if (*puVar16 == *puVar23) goto code_r0x00143f13;
          uVar17 = *puVar23 ^ *puVar16;
          uVar22 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
            }
          }
          uVar21 = ((uint)(uVar22 >> 3) & 0x1fffffff) + iVar27;
        }
        else {
          if ((puVar23 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar16 == (int)*puVar23))
          {
            puVar23 = (ulong *)((long)puVar23 + 4);
            puVar16 = (ulong *)((long)puVar16 + 4);
          }
          if ((puVar23 < source + ((ulong)(uint)inputSize - 6)) &&
             ((short)*puVar16 == (short)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 2);
            puVar16 = (ulong *)((long)puVar16 + 2);
          }
          if (puVar23 < source + ((ulong)(uint)inputSize - 5)) {
            puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar16 == (char)*puVar23));
          }
          uVar21 = (int)puVar23 - (int)puVar1;
        }
        goto LAB_00143f3b;
      }
      if (*puVar16 == *puVar1) {
        puVar16 = (ulong *)(pcVar20 + 0xc);
        puVar23 = (ulong *)((long)plVar9 + 0xc);
        goto LAB_00143ef7;
      }
      uVar22 = *puVar1 ^ *puVar16;
      lVar13 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      uVar21 = (uint)lVar13 >> 3;
LAB_00143f3b:
      if (pcVar8 < (char *)((long)plVar26 + (ulong)(uVar21 + 0xf0) / 0xff + 8)) {
        return 0;
      }
      dest = (char *)((long)plVar26 + 2);
      if (uVar21 < 0xf) {
        *pcVar12 = *pcVar12 + (char)uVar21;
      }
      else {
        *pcVar12 = *pcVar12 + '\x0f';
        dest[0] = -1;
        dest[1] = -1;
        dest[2] = -1;
        dest[3] = -1;
        lVar13 = 0;
        for (uVar10 = uVar21 - 0xf; 0x3fb < uVar10; uVar10 = uVar10 - 0x3fc) {
          pcVar20 = (char *)((long)plVar26 + lVar13 + 6);
          pcVar20[0] = -1;
          pcVar20[1] = -1;
          pcVar20[2] = -1;
          pcVar20[3] = -1;
          lVar13 = lVar13 + 4;
        }
        lVar5 = lVar13 + ((ulong)uVar10 & 0xffff) / 0xff;
        dest = (char *)((long)plVar26 + lVar5 + 3);
        *(char *)((long)plVar26 + lVar5 + 2) =
             (char)lVar13 + (char)((ushort)uVar10 / 0xff) + (char)uVar21 + -0xf;
      }
      lVar13 = (long)plVar9 + (ulong)uVar21;
      plVar9 = (long *)(lVar13 + 4);
      plVar19 = plVar9;
      if (source + ((ulong)(uint)inputSize - 0xb) <= plVar9) break;
      *(short *)((long)state + (ulong)((uint)(*(int *)(lVar13 + 2) * -0x61c8864f) >> 0x13) * 2) =
           ((short)lVar13 + 2) - sVar4;
      iVar27 = *(int *)plVar9;
      uVar22 = (ulong)((uint)(iVar27 * -0x61c8864f) >> 0x13);
      uVar17 = (ulong)*(ushort *)((long)state + uVar22 * 2);
      pcVar20 = (char *)(lVar24 + uVar17);
      *(short *)((long)state + uVar22 * 2) = (short)plVar9 - sVar4;
      if (*(int *)(lVar24 + uVar17) != iVar27) goto LAB_00143d8a;
      plVar26 = (long *)(dest + 1);
      *dest = '\0';
      pcVar12 = dest;
    } while( true );
  }
LAB_001443f7:
  pcVar20 = source + ((ulong)(uint)inputSize - (long)plVar19);
  if (pcVar8 < dest + (long)(pcVar20 + (ulong)(pcVar20 + 0xf0) / 0xff + 1)) {
    return 0;
  }
  if (pcVar20 < (char *)0xf) goto LAB_0014444d;
  *dest = -0x10;
  for (pcVar8 = pcVar20 + -0xf; dest = dest + 1, (char *)0xfe < pcVar8; pcVar8 = pcVar8 + -0xff) {
    *dest = -1;
  }
  goto LAB_0014445c;
code_r0x00143af6:
  puVar16 = puVar16 + 1;
  puVar23 = puVar23 + 1;
  goto LAB_00143ae1;
code_r0x0014424e:
  puVar16 = puVar16 + 1;
  puVar23 = puVar23 + 1;
  goto LAB_00144239;
code_r0x00143772:
  puVar23 = puVar23 + 1;
  puVar16 = puVar16 + 1;
  iVar18 = iVar18 + 8;
  goto LAB_0014375e;
code_r0x00143f13:
  puVar23 = puVar23 + 1;
  puVar16 = puVar16 + 1;
  iVar27 = iVar27 + 8;
  goto LAB_00143eff;
LAB_00143c44:
  pcVar8 = source + ((ulong)(uint)inputSize - (long)plVar19);
  if (pcVar8 < (char *)0xf) {
    *dest = (char)pcVar8 << 4;
  }
  else {
    *dest = -0x10;
    for (pcVar20 = pcVar8 + -0xf; dest = dest + 1, (char *)0xfe < pcVar20; pcVar20 = pcVar20 + -0xff
        ) {
      *dest = -1;
    }
    *dest = (char)pcVar20;
  }
LAB_001443dc:
  memcpy(dest + 1,plVar19,(size_t)pcVar8);
  return ((int)(dest + 1) + (int)pcVar8) - iVar3;
LAB_00143c86:
  pcVar20 = source + ((ulong)(uint)inputSize - (long)plVar19);
  if (pcVar8 < dest + (long)(pcVar20 + (ulong)(pcVar20 + 0xf0) / 0xff + 1)) {
    return 0;
  }
  if (pcVar20 < (char *)0xf) {
LAB_0014444d:
    *dest = (char)pcVar20 << 4;
    goto LAB_0014445e;
  }
  *dest = -0x10;
  for (pcVar8 = pcVar20 + -0xf; dest = dest + 1, (char *)0xfe < pcVar8; pcVar8 = pcVar8 + -0xff) {
    *dest = -1;
  }
LAB_0014445c:
  *dest = (char)pcVar8;
LAB_0014445e:
  memcpy(dest + 1,plVar19,(size_t)pcVar20);
  return ((int)(dest + 1) + (int)pcVar20) - iVar3;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}